

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *input)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __const_iterator local_98;
  undefined1 local_88 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __const_iterator local_68;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __const_iterator local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __const_iterator local_28;
  undefined1 local_19;
  string *local_18;
  string *input_local;
  string *result;
  
  local_19 = 0;
  local_18 = input;
  input_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  local_30._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  local_40._M_current =
       (char *)std::ranges::__find_if_fn::
               operator()<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_XMLHelper_hpp:529:63)>
                         ((__find_if_fn *)&std::ranges::find_if,__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_40);
  local_60 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::erase(__return_storage_ptr__,local_28,local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trim(std::__cxx11::string_const&)::_lambda(char)_2_>
            (&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_70._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_78);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
  local_a0._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         (__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_98,&local_a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (__return_storage_ptr__,local_68,local_98);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim( std::string const & input )
{
  std::string result = input;
  result.erase( result.begin(), std::ranges::find_if( result, []( char c ) noexcept { return !std::isspace( c ); } ) );
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}